

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

_Bool target_accept(wchar_t y,wchar_t x)

{
  _Bool _Var1;
  loc_conflict grid_00;
  square_conflict *psVar2;
  monster *mon_00;
  monster *mon;
  object *obj;
  loc grid;
  wchar_t x_local;
  wchar_t y_local;
  
  grid_00 = (loc_conflict)loc(x,y);
  psVar2 = square((chunk *)cave,grid_00);
  if (psVar2->mon < 0) {
    x_local._3_1_ = true;
  }
  else if (player->timed[6] == 0) {
    psVar2 = square((chunk *)cave,grid_00);
    if (0 < psVar2->mon) {
      mon_00 = square_monster((chunk *)cave,grid_00);
      _Var1 = monster_is_obvious(mon_00);
      if (_Var1) {
        return true;
      }
    }
    _Var1 = square_isvisibletrap((chunk *)player->cave,grid_00);
    if (_Var1) {
      x_local._3_1_ = true;
    }
    else {
      for (mon = (monster *)square_object((chunk *)player->cave,grid_00); mon != (monster *)0x0;
          mon = *(monster **)&mon->midx) {
        if (((object_kind *)mon->race == unknown_item_kind) ||
           (_Var1 = ignore_known_item_ok(player,(object *)mon), !_Var1)) {
          return true;
        }
      }
      _Var1 = square_isknown((chunk *)cave,grid_00);
      if ((_Var1) && (_Var1 = square_isinteresting((chunk *)player->cave,grid_00), _Var1)) {
        x_local._3_1_ = true;
      }
      else {
        x_local._3_1_ = false;
      }
    }
  }
  else {
    x_local._3_1_ = false;
  }
  return x_local._3_1_;
}

Assistant:

bool target_accept(int y, int x)
{
	struct loc grid = loc(x, y);
	struct object *obj;

	/* Player grids are always interesting */
	if (square(cave, grid)->mon < 0) return true;

	/* Handle hallucination */
	if (player->timed[TMD_IMAGE]) return false;

	/* Obvious monsters */
	if (square(cave, grid)->mon > 0) {
		struct monster *mon = square_monster(cave, grid);
		if (monster_is_obvious(mon)) {
			return true;
		}
	}

	/* Traps */
	if (square_isvisibletrap(player->cave, grid)) return true;

	/* Scan all objects in the grid */
	for (obj = square_object(player->cave, grid); obj; obj = obj->next) {
		/* Memorized object */
		if (obj->kind == unknown_item_kind
				 || !ignore_known_item_ok(player, obj)) {
			return true;
		}
	}

	/* Interesting memorized features */
	if (square_isknown(cave, grid)
			&& square_isinteresting(player->cave, grid)) {
		return true;
	}

	/* Nope */
	return false;
}